

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::KcpConnection::connectDestroyed(KcpConnection *this)

{
  enable_shared_from_this<sznet::net::KcpConnection> local_20;
  KcpConnection *local_10;
  KcpConnection *this_local;
  
  local_10 = this;
  EventLoop::assertInLoopThread(this->m_loop);
  if (this->m_state == kConnected) {
    setState(this,kDisconnected);
    std::enable_shared_from_this<sznet::net::KcpConnection>::shared_from_this(&local_20);
    std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::operator()
              (&this->m_kcpConnectionCallback,(shared_ptr<sznet::net::KcpConnection> *)&local_20);
    std::shared_ptr<sznet::net::KcpConnection>::~shared_ptr
              ((shared_ptr<sznet::net::KcpConnection> *)&local_20);
  }
  return;
}

Assistant:

void KcpConnection::connectDestroyed()
{
	m_loop->assertInLoopThread();
	if (m_state == kConnected)
	{
		setState(kDisconnected);
		m_kcpConnectionCallback(shared_from_this());
	}
}